

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O0

void __thiscall
MeshLib::StringTokenizer::StringTokenizer(StringTokenizer *this,char *buffer,char *seperator)

{
  size_t sVar1;
  char *pcVar2;
  int local_30;
  char c;
  int i;
  int str_len;
  char *pStr;
  char *seperator_local;
  char *buffer_local;
  StringTokenizer *this_local;
  
  List<char>::List(&this->m_tokens);
  sVar1 = strlen(buffer);
  if ((int)sVar1 != 0) {
    _i = buffer;
    for (local_30 = 0; local_30 < (int)sVar1; local_30 = local_30 + 1) {
      pcVar2 = strchr(seperator,(int)buffer[local_30]);
      if (pcVar2 != (char *)0x0) {
        buffer[local_30] = '\0';
        List<char>::Append(&this->m_tokens,_i);
        _i = buffer + (long)local_30 + 1;
      }
    }
    List<char>::Append(&this->m_tokens,_i);
  }
  return;
}

Assistant:

StringTokenizer::StringTokenizer( char * buffer, const char * seperator )
{

	char * pStr = NULL;

	int str_len = (int)strlen( buffer    );

	if( str_len == 0 ) return;

	pStr = buffer;

	for( int i = 0; i < str_len; i ++ )
	{
		char c = buffer[i];

		if( strchr( seperator, c ) )
		{
			buffer[i] = 0;
			m_tokens.Append( pStr );
			pStr = buffer+i+1;
		}
	
	}

	m_tokens.Append( pStr );
}